

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O0

void __thiscall libDAI::HAK::HAK(HAK *this,FactorGraph *fg,Properties *opts)

{
  byte bVar1;
  bool bVar2;
  value vVar3;
  int iVar4;
  undefined8 uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pVVar6;
  allocator<char> *__a;
  ulong uVar7;
  ostream *poVar8;
  RegionGraph *in_RSI;
  long *in_RDI;
  RegionGraph rg;
  const_iterator cli;
  const_iterator c;
  VarSet i0d;
  const_iterator i0;
  set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_> scl;
  size_t i;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> cl;
  RegionGraph *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  value_type *in_stack_fffffffffffffb78;
  DAIAlg<libDAI::RegionGraph> *in_stack_fffffffffffffb80;
  VarSet *in_stack_fffffffffffffb88;
  ostream *in_stack_fffffffffffffb90;
  allocator<char> *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbe0;
  RegionGraph *pRVar9;
  size_t in_stack_fffffffffffffbe8;
  Exception *in_stack_fffffffffffffbf0;
  RegionGraph *in_stack_fffffffffffffc18;
  ostream *in_stack_fffffffffffffc20;
  FactorGraph *in_stack_fffffffffffffc28;
  size_t in_stack_fffffffffffffcf8;
  Var *in_stack_fffffffffffffd00;
  VarSet *in_stack_fffffffffffffd08;
  HAK *in_stack_fffffffffffffd10;
  FactorGraph *in_stack_fffffffffffffd18;
  HAK *in_stack_fffffffffffffd20;
  VarSet *in_stack_fffffffffffffd30;
  char local_1c1 [33];
  VarSet *local_1a0;
  VarSet *local_198;
  VarSet *local_190;
  __normal_iterator<const_libDAI::VarSet_*,_std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>_>
  local_188;
  _Base_ptr local_180;
  _Self local_178;
  _Self local_170;
  Var *local_168;
  const_iterator local_100;
  const_iterator local_f8;
  ulong local_88;
  pointer in_stack_ffffffffffffff90;
  FactorGraph *in_stack_ffffffffffffff98;
  RegionGraph *in_stack_ffffffffffffffa0;
  
  DAIAlg<libDAI::RegionGraph>::DAIAlg
            (in_stack_fffffffffffffb80,(Properties *)in_stack_fffffffffffffb78);
  *in_RDI = (long)&PTR_clone_00d4d878;
  in_RDI[0x40] = 0;
  in_RDI[0x41] = 0;
  in_RDI[0x42] = 0;
  in_RDI[0x43] = 0;
  in_RDI[0x3d] = 0;
  in_RDI[0x3e] = 0;
  in_RDI[0x3f] = 0;
  in_RDI[0x40] = 0;
  {unnamed_type#1}::HAK((anon_struct_56_7_6184997f_for_Props *)0xb48038);
  in_RDI[0x44] = 0;
  in_RDI[0x45] = 0;
  *(undefined1 (*) [16])(in_RDI + 0x46) = (undefined1  [16])0x0;
  in_RDI[0x48] = 0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb4808f)
  ;
  in_RDI[0x49] = 0;
  in_RDI[0x4a] = 0;
  in_RDI[0x4b] = 0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb480ca)
  ;
  in_RDI[0x4c] = 0;
  in_RDI[0x4d] = 0;
  in_RDI[0x4e] = 0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb48105)
  ;
  in_RDI[0x4f] = 0;
  in_RDI[0x50] = 0;
  in_RDI[0x51] = 0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb48140)
  ;
  bVar1 = (**(code **)(*in_RDI + 0x88))();
  if ((bVar1 & 1) == 0) {
    uVar5 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    Exception::Exception
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    __cxa_throw(uVar5,&Exception::typeinfo,Exception::~Exception);
  }
  std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::vector
            ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)0xb482a0);
  vVar3 = ClustersType::operator_cast_to_value((ClustersType *)(in_RDI + 0x3d));
  if (vVar3 == MIN) {
    FactorGraph::Cliques(in_stack_fffffffffffffc28);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::operator=
              ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)in_stack_fffffffffffffb80,
               (vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)in_stack_fffffffffffffb78)
    ;
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector
              ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)in_stack_fffffffffffffb80)
    ;
  }
  else {
    vVar3 = ClustersType::operator_cast_to_value((ClustersType *)(in_RDI + 0x3d));
    if (vVar3 == DELTA) {
      local_88 = 0;
      while (uVar7 = local_88, iVar4 = (*(in_RSI->super_GraphicalModel)._vptr_GraphicalModel[5])(),
            uVar7 < CONCAT44(extraout_var,iVar4)) {
        in_stack_fffffffffffffc18 = in_RSI;
        iVar4 = (*(in_RSI->super_GraphicalModel)._vptr_GraphicalModel[6])(in_RSI,local_88);
        in_stack_fffffffffffffc20 = (ostream *)CONCAT44(extraout_var_00,iVar4);
        (*(in_stack_fffffffffffffc18->super_GraphicalModel)._vptr_GraphicalModel[0xd])
                  (&stack0xffffffffffffff58,in_stack_fffffffffffffc18,in_stack_fffffffffffffc20);
        std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::push_back
                  ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
                   CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   (value_type *)in_stack_fffffffffffffb68);
        VarSet::~VarSet((VarSet *)0xb4840f);
        local_88 = local_88 + 1;
      }
    }
    else {
      vVar3 = ClustersType::operator_cast_to_value((ClustersType *)(in_RDI + 0x3d));
      if (vVar3 != LOOP) {
        __a = (allocator<char> *)__cxa_allocate_exception(0x10);
        __s = local_1c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffbb0,__s,__a);
        Exception::Exception
                  (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
        __cxa_throw(__a,&Exception::typeinfo,Exception::~Exception);
      }
      FactorGraph::Cliques(in_stack_fffffffffffffc28);
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::operator=
                ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
                 in_stack_fffffffffffffb80,
                 (vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
                 in_stack_fffffffffffffb78);
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector
                ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
                 in_stack_fffffffffffffb80);
      std::set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>::set
                ((set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_> *)
                 0xb484ce);
      (*(in_RSI->super_GraphicalModel)._vptr_GraphicalModel[7])();
      local_f8 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin
                           ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
                            in_stack_fffffffffffffb68);
      while( true ) {
        (*(in_RSI->super_GraphicalModel)._vptr_GraphicalModel[7])();
        local_100 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end
                              ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
                               in_stack_fffffffffffffb68);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                            *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                           (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                            *)in_stack_fffffffffffffb68);
        if (!bVar2) break;
        pRVar9 = in_RSI;
        pVVar6 = __gnu_cxx::
                 __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                 ::operator*(&stack0xffffffffffffff08);
        (*(pRVar9->super_GraphicalModel)._vptr_GraphicalModel[0xe])
                  (&stack0xfffffffffffffee0,pRVar9,pVVar6);
        if (1 < (ulong)in_RDI[0x43]) {
          __gnu_cxx::
          __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
          ::operator*(&stack0xffffffffffffff08);
          VarSet::VarSet((VarSet *)in_stack_fffffffffffffb80,(Var *)in_stack_fffffffffffffb78);
          __gnu_cxx::
          __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
          ::operator*(&stack0xffffffffffffff08);
          pRVar9 = in_RSI;
          pVVar6 = __gnu_cxx::
                   __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                   ::operator*(&stack0xffffffffffffff08);
          (*(pRVar9->super_GraphicalModel)._vptr_GraphicalModel[0xe])
                    (&stack0xfffffffffffffea0,pRVar9,pVVar6);
          in_stack_fffffffffffffb68 = (RegionGraph *)&stack0xfffffffffffffea0;
          findLoopClusters(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                           (set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>
                            *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                           in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                           in_stack_fffffffffffffd30);
          VarSet::~VarSet((VarSet *)0xb4867b);
          VarSet::~VarSet((VarSet *)0xb48688);
        }
        VarSet::~VarSet((VarSet *)0xb4870c);
        local_168 = (Var *)__gnu_cxx::
                           __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                           ::operator++((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                                         *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb74);
      }
      local_170._M_node =
           (_Base_ptr)
           std::set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>::
           begin((set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_> *)
                 in_stack_fffffffffffffb68);
      while( true ) {
        local_178._M_node =
             (_Base_ptr)
             std::set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>::
             end((set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_> *)
                 in_stack_fffffffffffffb68);
        bVar2 = std::operator!=(&local_170,&local_178);
        if (!bVar2) break;
        std::_Rb_tree_const_iterator<libDAI::VarSet>::operator*
                  ((_Rb_tree_const_iterator<libDAI::VarSet> *)0xb4878c);
        std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::push_back
                  ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
                   in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        local_180 = (_Base_ptr)
                    std::_Rb_tree_const_iterator<libDAI::VarSet>::operator++
                              ((_Rb_tree_const_iterator<libDAI::VarSet> *)in_stack_fffffffffffffb78,
                               in_stack_fffffffffffffb74);
      }
      uVar7 = (**(code **)(*in_RDI + 0x30))();
      if (2 < uVar7) {
        poVar8 = std::operator<<((ostream *)&std::cout,"HAK uses the following clusters: ");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        local_190 = (VarSet *)
                    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::begin
                              ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
                               in_stack_fffffffffffffb68);
        __gnu_cxx::
        __normal_iterator<libDAI::VarSet_const*,std::vector<libDAI::VarSet,std::allocator<libDAI::VarSet>>>
        ::__normal_iterator<libDAI::VarSet*>
                  ((__normal_iterator<const_libDAI::VarSet_*,_std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   (__normal_iterator<libDAI::VarSet_*,_std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>_>
                    *)in_stack_fffffffffffffb68);
        while( true ) {
          local_198 = (VarSet *)
                      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::end
                                ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
                                 in_stack_fffffffffffffb68);
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_libDAI::VarSet_*,_std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>_>
                              *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                             (__normal_iterator<libDAI::VarSet_*,_std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>_>
                              *)in_stack_fffffffffffffb68);
          if (!bVar2) break;
          __gnu_cxx::
          __normal_iterator<const_libDAI::VarSet_*,_std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>_>
          ::operator*(&local_188);
          poVar8 = libDAI::operator<<(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          local_1a0 = (VarSet *)
                      __gnu_cxx::
                      __normal_iterator<const_libDAI::VarSet_*,_std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>_>
                      ::operator++((__normal_iterator<const_libDAI::VarSet_*,_std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>_>
                                    *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb74);
        }
      }
      std::set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>::~set
                ((set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_> *)
                 0xb488ca);
    }
  }
  RegionGraph::RegionGraph
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)in_stack_ffffffffffffff90);
  (**(code **)(*in_RDI + 0x28))();
  RegionGraph::operator=
            ((RegionGraph *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
             in_stack_fffffffffffffb68);
  constructMessages(in_stack_fffffffffffffd10);
  uVar7 = (**(code **)(*in_RDI + 0x30))();
  if (2 < uVar7) {
    std::operator<<((ostream *)&std::cout,"HAK regiongraph: ");
    in_stack_fffffffffffffb80 = (DAIAlg<libDAI::RegionGraph> *)(**(code **)(*in_RDI + 0x28))();
    poVar8 = libDAI::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  RegionGraph::~RegionGraph
            ((RegionGraph *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector
            ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)in_stack_fffffffffffffb80);
  return;
}

Assistant:

HAK::HAK(const FactorGraph & fg, const Properties &opts) : DAIAlgRG(opts), Props(), _maxdiff(0.0), _iterations(0UL), _Qa(), _Qb(), _muab(), _muba() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        vector<VarSet> cl;
        if( Props.clusters == ClustersType::MIN ) {
            cl = fg.Cliques();
        } else if( Props.clusters == ClustersType::DELTA ) {
            for( size_t i = 0; i < fg.nrVars(); i++ )
                cl.push_back(fg.Delta(fg.var(i))); 
        } else if( Props.clusters == ClustersType::LOOP ) {
            cl = fg.Cliques();
            set<VarSet> scl;
            for( vector<Var>::const_iterator i0 = fg.vars().begin(); i0 != fg.vars().end(); i0++ ) {
                VarSet i0d = fg.delta(*i0);
                if( Props.loopdepth > 1 )
                    findLoopClusters( fg, scl, *i0, *i0, Props.loopdepth - 1, fg.delta(*i0) );
            }
            for( set<VarSet>::const_iterator c = scl.begin(); c != scl.end(); c++ )
                cl.push_back(*c);
            if( Verbose() >= 3 ) {
                cout << "HAK uses the following clusters: " << endl;
                for( vector<VarSet>::const_iterator cli = cl.begin(); cli != cl.end(); cli++ )
                    cout << *cli << endl;
            }
        } else
            DAI_THROW(UNKNOWN_PROPERTY_TYPE);

        RegionGraph rg(fg,cl);
        grm() = rg;
        constructMessages();

    /*  if( (Props.clusters == ClustersType::LOOP) ) {
             double c_sum = 0.0;
             for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
                 c_sum += grm().OR(alpha).c();
             for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
                 c_sum += grm().IR(beta).c();
             cout << "Sum of cluster numbers: " << c_sum << endl;
        }*/

        if( Verbose() >= 3 )
            cout << "HAK regiongraph: " << grm() << endl;
    }